

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::EnableDepthTest(GLContextState *this,bool bEnable)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_68 [8];
  string msg_1;
  GLenum err_1;
  undefined1 local_38 [8];
  string msg;
  GLenum err;
  bool bEnable_local;
  GLContextState *this_local;
  
  msg.field_2._M_local_buf[0xf] = bEnable;
  bVar1 = EnableStateHelper::operator!=(&(this->m_DSState).m_DepthEnableState,bEnable);
  if (bVar1) {
    if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
      glDisable();
      msg_1.field_2._8_4_ = glGetError();
      if (msg_1.field_2._8_4_ != 0) {
        LogError<false,char[29],char[17],unsigned_int>
                  (false,"EnableDepthTest",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x1df,(char (*) [29])"Failed to disable depth test",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
        FormatString<char[6]>((string *)local_68,(char (*) [6])0x4585f6);
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"EnableDepthTest",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x1df);
        std::__cxx11::string::~string((string *)local_68);
      }
    }
    else {
      glEnable();
      msg.field_2._8_4_ = glGetError();
      if (msg.field_2._8_4_ != 0) {
        LogError<false,char[28],char[17],unsigned_int>
                  (false,"EnableDepthTest",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x1da,(char (*) [28])"Failed to enable depth test",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
        FormatString<char[6]>((string *)local_38,(char (*) [6])0x4585f6);
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"EnableDepthTest",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x1da);
        std::__cxx11::string::~string((string *)local_38);
      }
    }
    EnableStateHelper::operator=
              (&(this->m_DSState).m_DepthEnableState,(bool)(msg.field_2._M_local_buf[0xf] & 1));
  }
  return;
}

Assistant:

void GLContextState::EnableDepthTest(bool bEnable)
{
    if (m_DSState.m_DepthEnableState != bEnable)
    {
        if (bEnable)
        {
            glEnable(GL_DEPTH_TEST);
            DEV_CHECK_GL_ERROR("Failed to enable depth test");
        }
        else
        {
            glDisable(GL_DEPTH_TEST);
            DEV_CHECK_GL_ERROR("Failed to disable depth test");
        }
        m_DSState.m_DepthEnableState = bEnable;
    }
}